

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

FaceIter __thiscall CMU462::HalfedgeMesh::eraseVertex(HalfedgeMesh *this,VertexIter v)

{
  _List_node_base *p_Var1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  _List_iterator<CMU462::Halfedge> *hj_1;
  pointer p_Var5;
  long lVar6;
  value_type vVar7;
  _List_iterator<CMU462::Halfedge> *hj_2;
  pointer p_Var8;
  _List_iterator<CMU462::Edge> *ej;
  pointer p_Var9;
  HalfedgeIter hi;
  HalfedgeIter h;
  HalfedgeIter hj;
  HalfedgeIter ht;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_all;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_first;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_last;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  value_type local_130;
  value_type local_128;
  value_type local_120;
  value_type local_118;
  _List_node_base *local_110;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_108;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_e8;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_c8;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_a8;
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_88;
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_68;
  const_iterator local_50;
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_48;
  
  local_128._M_node = v._M_node[0xc]._M_prev;
  local_118._M_node = local_128._M_node[1]._M_next;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_a8,&local_128);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_a8,&local_118);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_e8,(value_type *)&local_128._M_node[1]._M_prev);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               *)&local_48,(value_type *)(local_118._M_node + 2));
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_node = v._M_node;
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)&local_68,(value_type *)&local_128._M_node[2]._M_prev);
  local_110 = local_128._M_node[3]._M_next;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130._M_node = local_118._M_node[1]._M_prev;
  vVar7._M_node = local_118._M_node;
  while (local_128._M_node != local_130._M_node) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_a8,&local_130);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_a8,(value_type *)(local_130._M_node + 1));
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_e8,(value_type *)&local_130._M_node[1]._M_prev);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 *)&local_48,(value_type *)(local_130._M_node[1]._M_next + 2));
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&local_68,(value_type *)&local_130._M_node[2]._M_prev);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&local_88,(value_type *)(local_130._M_node + 3));
    local_120._M_node = local_130._M_node;
    while (local_120._M_node[1]._M_prev != vVar7._M_node) {
      local_120._M_node = local_120._M_node[1]._M_prev;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&local_108,&local_120);
    }
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_c8,&local_120);
    vVar7._M_node = local_130._M_node[1]._M_next;
    local_130._M_node = vVar7._M_node[1]._M_prev;
  }
  while (local_130._M_node[1]._M_prev != vVar7._M_node) {
    local_130._M_node = local_130._M_node[1]._M_prev;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_108,&local_130);
  }
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_c8,&local_130);
  p_Var2 = local_a8._M_impl.super__Vector_impl_data._M_finish;
  for (lVar6 = 0; p_Var5 = local_108._M_impl.super__Vector_impl_data._M_start,
      (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8._M_impl.super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
    p_Var1 = local_e8._M_impl.super__Vector_impl_data._M_start[lVar6]._M_node;
    local_c8._M_impl.super__Vector_impl_data._M_start[lVar6]._M_node[1]._M_prev = p_Var1;
    local_48._M_impl.super__Vector_impl_data._M_start[lVar6]._M_node[0xc]._M_prev = p_Var1;
  }
  for (; p_Var5 != local_108._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
    p_Var5->_M_node[3]._M_next = local_110;
  }
  local_110[9]._M_next = (local_e8._M_impl.super__Vector_impl_data._M_start)->_M_node;
  for (p_Var5 = local_a8._M_impl.super__Vector_impl_data._M_start; p_Var5 != p_Var2;
      p_Var5 = p_Var5 + 1) {
    std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::erase
              (&this->halfedges,p_Var5->_M_node);
  }
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::erase
            (&this->vertices,local_50);
  p_Var4 = local_68._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var9 = local_68._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = local_88._M_impl.super__Vector_impl_data._M_finish, p_Var9 != p_Var4;
      p_Var9 = p_Var9 + 1) {
    std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::erase
              (&this->edges,p_Var9->_M_node);
  }
  for (p_Var8 = local_88._M_impl.super__Vector_impl_data._M_start; p_Var8 != p_Var3;
      p_Var8 = p_Var8 + 1) {
    std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::erase
              (&this->faces,p_Var8->_M_node);
  }
  std::
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ::~_Vector_base(&local_88);
  std::
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Vector_base(&local_68);
  std::
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~_Vector_base(&local_48);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_108);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_c8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_e8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_a8);
  return (FaceIter)local_110;
}

Assistant:

FaceIter HalfedgeMesh::eraseVertex(VertexIter v) {
  // This method should replace the given vertex and all its neighboring
  // edges and faces with a single face, returning the new face.

  // Collect
  // HalfEdges
  auto h = v->halfedge(), ht = h->twin();
  vector<HalfedgeIter> h_to_be_deleted, h_outer_first, h_outer_last, h_outer_all;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(ht);
  h_outer_first.push_back(h->next());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.push_back(ht->vertex());

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(h->edge());

  // Faces
  auto f0 = h->face();
  vector<FaceIter> f_to_be_deleted;

  // Iterations through remaining
  auto hp = ht, hi = hp->next();
  while (hi != h) {
    h_to_be_deleted.push_back(hi);
    h_to_be_deleted.push_back(hi->twin());
    h_outer_first.push_back(hi->next());

    v_outer_vec.push_back(hi->twin()->vertex());
    e_to_be_deleted.push_back(hi->edge());
    f_to_be_deleted.push_back(hi->face());

    auto hj = hi;
    while (hj->next() != hp) {
      hj = hj->next();
      h_outer_all.push_back(hj);
    }
    h_outer_last.push_back(hj);

    hp = hi->twin();
    hi = hp->next();
  }
  while (hi->next() != hp) {
    hi = hi->next();
    h_outer_all.push_back(hi);
  }
  h_outer_last.push_back(hi);

  // Reassign
  Size n = h_outer_first.size();
  for (Index i = 0; i < n; ++i) {
    h_outer_last[i]->next() = h_outer_first[i];
    v_outer_vec[i]->halfedge() = h_outer_first[i];
  }
  for (auto& hj : h_outer_all) {
    hj->face() = f0;
  }
  f0->halfedge() = h_outer_first.front();

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return f0;
}